

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaVStart(xmlSchemaValidCtxtPtr vctxt)

{
  xmlElementType nodeType;
  int iVar1;
  int iVar2;
  xmlNodePtr pxVar3;
  int *piVar4;
  char *message;
  char *funcName;
  xmlChar *in_R8;
  int *in_R9;
  xmlSchemaNodeInfoPtr pxVar5;
  _xmlNode *p_Var6;
  xmlNodePtr pxVar7;
  xmlChar *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  
  iVar1 = xmlSchemaPreRun(vctxt);
  if (iVar1 < 0) {
    return -1;
  }
  if (vctxt->doc == (xmlDoc *)0x0) {
    if (vctxt->reader == (xmlTextReaderPtr)0x0) {
      if ((vctxt->sax == (xmlSAXHandlerPtr)0x0) || (vctxt->parserCtxt == (xmlParserCtxtPtr)0x0)) {
        funcName = "xmlSchemaVStart";
        message = "no instance to validate";
        goto LAB_0018ff7c;
      }
      iVar1 = xmlParseDocument(vctxt->parserCtxt);
LAB_0018fee8:
      xmlSchemaPostRun(vctxt);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    else {
      xmlSchemaPostRun(vctxt);
    }
    iVar1 = vctxt->err;
  }
  else {
    pxVar3 = vctxt->validationRoot;
    if ((pxVar3 == (xmlNodePtr)0x0) &&
       (pxVar3 = xmlDocGetRootElement(vctxt->doc), pxVar3 == (xmlNodePtr)0x0)) {
      iVar1 = 1;
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_ERR_INTERNAL_ERROR,(xmlNodePtr)0x0,
                          (xmlSchemaBasicItemPtr)0x0,"The document has no document element",
                          (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    }
    else {
      vctxt->depth = -1;
      vctxt->validationRoot = pxVar3;
      pxVar5 = (xmlSchemaNodeInfoPtr)0x0;
      pxVar7 = pxVar3;
LAB_0018fcd0:
      p_Var6 = pxVar7;
      if ((vctxt->skipDepth != -1) && (vctxt->skipDepth <= vctxt->depth)) goto LAB_0018fe73;
      nodeType = p_Var6->type;
      if (1 < nodeType - XML_TEXT_NODE) {
        if (nodeType == XML_ELEMENT_NODE) {
          vctxt->depth = vctxt->depth + 1;
          iVar2 = xmlSchemaValidatorPushElem(vctxt);
          iVar1 = -1;
          if (iVar2 == -1) goto LAB_0018ff8b;
          pxVar5 = vctxt->inode;
          pxVar5->node = p_Var6;
          pxVar5->nodeLine = (uint)p_Var6->line;
          pxVar5->localName = p_Var6->name;
          if (p_Var6->ns != (xmlNs *)0x0) {
            pxVar5->nsName = p_Var6->ns->href;
          }
          *(byte *)&pxVar5->flags = (byte)pxVar5->flags | 0x20;
          vctxt->nbAttrInfos = 0;
          for (pxVar7 = (xmlNodePtr)p_Var6->properties; pxVar7 != (xmlNodePtr)0x0;
              pxVar7 = pxVar7->next) {
            if (pxVar7->ns == (xmlNs *)0x0) {
              in_R8 = (xmlChar *)0x0;
            }
            else {
              in_R8 = pxVar7->ns->href;
            }
            piVar4 = (int *)xmlNodeListGetString(pxVar7->doc,pxVar7->children,1);
            in_R9 = piVar4;
            iVar1 = xmlSchemaValidatorPushAttribute
                              (vctxt,pxVar7,pxVar5->nodeLine,pxVar7->name,in_R8,(int)piVar4,
                               in_stack_ffffffffffffffa8,(int)in_stack_ffffffffffffffb0);
            if (iVar1 == -1) {
              xmlSchemaInternalErr2
                        ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaDocWalk",
                         "calling xmlSchemaValidatorPushAttribute()",(xmlChar *)0x0,in_R8);
              (*xmlFree)(piVar4);
              goto LAB_0018ff86;
            }
          }
          iVar1 = xmlSchemaValidateElem(vctxt);
          if (iVar1 != 0) {
            if (iVar1 != -1) goto LAB_0018fe46;
            funcName = "xmlSchemaDocWalk";
            message = "calling xmlSchemaValidateElem()";
            goto LAB_0018ff7c;
          }
          if ((vctxt->skipDepth == -1) || (vctxt->depth < vctxt->skipDepth)) goto LAB_0018fd41;
        }
        else if (nodeType - XML_ENTITY_REF_NODE < 2) {
          funcName = "xmlSchemaVDocWalk";
          message = 
          "there is at least one entity reference in the node-tree currently being validated. Processing of entities with this XML Schema processor is not supported (yet). Please substitute entities before validation."
          ;
          goto LAB_0018ff7c;
        }
        goto LAB_0018fe46;
      }
      if ((pxVar5 != (xmlSchemaNodeInfoPtr)0x0) && ((pxVar5->flags & 0x20U) != 0)) {
        pxVar5->flags = pxVar5->flags & 0xffffffdf;
      }
      in_R8 = &DAT_00000001;
      iVar1 = xmlSchemaVPushText(vctxt,nodeType,p_Var6->content,-1,1,in_R9);
      if (-1 < iVar1) goto LAB_0018fd41;
      funcName = "xmlSchemaVDocWalk";
      message = "calling xmlSchemaVPushText()";
LAB_0018ff7c:
      xmlSchemaInternalErr2((xmlSchemaAbstractCtxtPtr)vctxt,funcName,message,(xmlChar *)0x0,in_R8);
LAB_0018ff86:
      iVar1 = -1;
    }
LAB_0018ff8b:
    xmlSchemaPostRun(vctxt);
  }
  return iVar1;
LAB_0018fd41:
  pxVar7 = p_Var6->children;
  if (p_Var6->children != (_xmlNode *)0x0) goto LAB_0018fcd0;
LAB_0018fe46:
  while( true ) {
    if (p_Var6->type == XML_ELEMENT_NODE) {
      if (p_Var6 != vctxt->inode->node) {
        funcName = "xmlSchemaVDocWalk";
        message = "element position mismatch";
        goto LAB_0018ff7c;
      }
      iVar1 = xmlSchemaValidatorPopElem(vctxt);
      if (iVar1 < 0) {
        funcName = "xmlSchemaVDocWalk";
        message = "calling xmlSchemaValidatorPopElem()";
        goto LAB_0018ff7c;
      }
      if (p_Var6 == pxVar3) goto LAB_0018fee8;
    }
LAB_0018fe73:
    pxVar7 = p_Var6->next;
    if (p_Var6->next != (_xmlNode *)0x0) break;
    p_Var6 = p_Var6->parent;
  }
  goto LAB_0018fcd0;
}

Assistant:

static int
xmlSchemaVStart(xmlSchemaValidCtxtPtr vctxt)
{
    int ret = 0;

    if (xmlSchemaPreRun(vctxt) < 0)
        return(-1);

    if (vctxt->doc != NULL) {
	/*
	 * Tree validation.
	 */
	ret = xmlSchemaVDocWalk(vctxt);
#ifdef LIBXML_READER_ENABLED
    } else if (vctxt->reader != NULL) {
	/*
	 * XML Reader validation.
	 */
#ifdef XML_SCHEMA_READER_ENABLED
	ret = xmlSchemaVReaderWalk(vctxt);
#endif
#endif
    } else if ((vctxt->sax != NULL) && (vctxt->parserCtxt != NULL)) {
	/*
	 * SAX validation.
	 */
	ret = xmlParseDocument(vctxt->parserCtxt);
    } else {
	VERROR_INT("xmlSchemaVStart",
	    "no instance to validate");
	ret = -1;
    }

    xmlSchemaPostRun(vctxt);
    if (ret == 0)
	ret = vctxt->err;
    return (ret);
}